

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

void htmlParseContent(htmlParserCtxtPtr ctxt)

{
  xmlChar **ppxVar1;
  int *piVar2;
  byte bVar3;
  xmlParserInputPtr pxVar4;
  xmlChar *pxVar5;
  __int32_t *p_Var6;
  charactersSAXFunc p_Var7;
  __int32_t **pp_Var8;
  int iVar9;
  
  pxVar4 = ctxt->input;
  if (((pxVar4->flags & 0x40) == 0) && ((long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  iVar9 = ctxt->disableSAX;
  while (iVar9 < 2) {
    pxVar4 = ctxt->input;
    pxVar5 = pxVar4->cur;
    if (pxVar4->end <= pxVar5) break;
    if ((ctxt->endCheckState == 0) && (*pxVar5 == '<')) {
      bVar3 = pxVar5[1];
      if (bVar3 == 0x21) {
        pp_Var8 = __ctype_toupper_loc();
        p_Var6 = *pp_Var8;
        if (((((p_Var6[pxVar5[2]] != 0x44) || (p_Var6[pxVar5[3]] != 0x4f)) ||
             (p_Var6[pxVar5[4]] != 0x43)) ||
            ((p_Var6[pxVar5[5]] != 0x54 || (p_Var6[pxVar5[6]] != 0x59)))) ||
           ((p_Var6[pxVar5[7]] != 0x50 || (p_Var6[pxVar5[8]] != 0x45)))) {
          if ((pxVar5[2] != 0x2d) || (pxVar5[3] != '-')) {
            pxVar4->cur = pxVar5 + 2;
            pxVar4->col = pxVar4->col + 2;
            goto LAB_001685f7;
          }
          pxVar4->cur = pxVar5 + 4;
          pxVar4->col = pxVar4->col + 4;
          iVar9 = 0;
          goto LAB_001685ff;
        }
        htmlParseDocTypeDecl(ctxt);
      }
      else if (bVar3 == 0x3f) {
        pxVar4->cur = pxVar5 + 1;
        pxVar4->col = pxVar4->col + 1;
LAB_001685f7:
        iVar9 = 1;
LAB_001685ff:
        htmlParseComment(ctxt,iVar9);
      }
      else if (bVar3 == 0x2f) {
        htmlParseEndTag(ctxt);
      }
      else if ((byte)((bVar3 | 0x20) + 0x9f) < 0x1a) {
        htmlParseElementInternal(ctxt);
      }
      else {
        htmlStartCharData(ctxt);
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
           (p_Var7 = ctxt->sax->characters, p_Var7 != (charactersSAXFunc)0x0)) {
          (*p_Var7)(ctxt->userData,"<",1);
        }
        pxVar4 = ctxt->input;
        ppxVar1 = &pxVar4->cur;
        *ppxVar1 = *ppxVar1 + 1;
        piVar2 = &pxVar4->col;
        *piVar2 = *piVar2 + 1;
      }
    }
    else {
      htmlParseCharData(ctxt,0);
    }
    pxVar4 = ctxt->input;
    if ((((pxVar4->flags & 0x40) == 0) && (500 < (long)pxVar4->cur - (long)pxVar4->base)) &&
       ((long)pxVar4->end - (long)pxVar4->cur < 500)) {
      xmlParserShrink(ctxt);
    }
    pxVar4 = ctxt->input;
    if (((pxVar4->flags & 0x40) == 0) && ((long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    iVar9 = ctxt->disableSAX;
  }
  if (ctxt->input->cur < ctxt->input->end) {
    return;
  }
  htmlAutoCloseOnEnd(ctxt);
  return;
}

Assistant:

static void
htmlParseContent(htmlParserCtxtPtr ctxt) {
    GROW;

    while ((PARSER_STOPPED(ctxt) == 0) &&
           (ctxt->input->cur < ctxt->input->end)) {
        int mode;

        mode = ctxt->endCheckState;

        if ((mode == 0) && (CUR == '<')) {
            if (NXT(1) == '/') {
	        htmlParseEndTag(ctxt);
            } else if (NXT(1) == '!') {
                /*
                 * Sometimes DOCTYPE arrives in the middle of the document
                 */
                if ((UPP(2) == 'D') && (UPP(3) == 'O') &&
                    (UPP(4) == 'C') && (UPP(5) == 'T') &&
                    (UPP(6) == 'Y') && (UPP(7) == 'P') &&
                    (UPP(8) == 'E')) {
                    htmlParseDocTypeDecl(ctxt);
                } else if ((NXT(2) == '-') && (NXT(3) == '-')) {
                    SKIP(4);
                    htmlParseComment(ctxt, /* bogus */ 0);
                } else {
                    SKIP(2);
                    htmlParseComment(ctxt, /* bogus */ 1);
                }
            } else if (NXT(1) == '?') {
                SKIP(1);
                htmlParseComment(ctxt, /* bogus */ 1);
            } else if (IS_ASCII_LETTER(NXT(1))) {
                htmlParseElementInternal(ctxt);
            } else {
                htmlStartCharData(ctxt);
                if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
                    (ctxt->sax->characters != NULL))
                    ctxt->sax->characters(ctxt->userData, BAD_CAST "<", 1);
                SKIP(1);
            }
        } else {
            htmlParseCharData(ctxt, /* partial */ 0);
        }

        SHRINK;
        GROW;
    }

    if (ctxt->input->cur >= ctxt->input->end)
        htmlAutoCloseOnEnd(ctxt);
}